

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::test_LogEscapeMessage::test_method(test_LogEscapeMessage *this)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  bool bVar1;
  long in_FS_OFFSET;
  string NUL;
  char *in_stack_fffffffffffffcf8;
  char *in_stack_fffffffffffffd00;
  char *in_stack_fffffffffffffd08;
  allocator<char> *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  lazy_ostream *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  unit_test_log_t *line_num;
  const_string *in_stack_fffffffffffffd30;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffd38;
  unit_test_log_t *this_00;
  size_t in_stack_fffffffffffffd50;
  char *pcVar2;
  char *in_stack_fffffffffffffd58;
  char *pcVar3;
  undefined1 local_220 [16];
  undefined1 local_210 [71];
  const_string local_1c9;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [80];
  undefined1 local_158 [16];
  undefined1 local_148 [80];
  undefined1 local_f8 [16];
  undefined1 local_e8 [64];
  undefined1 local_a8 [64];
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
               (unsigned_long)in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28
               ,(const_string *)in_stack_fffffffffffffd20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd00,(char (*) [1])in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
               (unsigned_long)in_stack_fffffffffffffcf8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
               (char *)in_stack_fffffffffffffd10);
    str._M_str = in_stack_fffffffffffffd58;
    str._M_len = in_stack_fffffffffffffd50;
    BCLog::LogEscapeMessage_abi_cxx11_(str);
    in_stack_fffffffffffffd08 = anon_var_dwarf_e553a3;
    in_stack_fffffffffffffd00 = anon_var_dwarf_e55389;
    in_stack_fffffffffffffcf8 = anon_var_dwarf_e55396;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
              (local_e8,local_f8,0x5d0,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcf8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffcf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
               (unsigned_long)in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28
               ,(const_string *)in_stack_fffffffffffffd20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd00,(char (*) [1])in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
               (unsigned_long)in_stack_fffffffffffffcf8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
               (char *)in_stack_fffffffffffffd10);
    str_00._M_str = in_stack_fffffffffffffd58;
    str_00._M_len = in_stack_fffffffffffffd50;
    BCLog::LogEscapeMessage_abi_cxx11_(str_00);
    in_stack_fffffffffffffd08 = "\"Message\\n with newlines\\n\"";
    in_stack_fffffffffffffd00 = "Message\n with newlines\n";
    in_stack_fffffffffffffcf8 = "BCLog::LogEscapeMessage(\"Message\\n with newlines\\n\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[24]>
              (local_148,local_158,0x5d2,1,2,local_48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcf8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffcf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    pcVar2 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    pcVar3 = (char *)0x63;
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
               (unsigned_long)in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,
               (const_string *)in_stack_fffffffffffffd20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd00,(char (*) [1])in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
               (unsigned_long)in_stack_fffffffffffffcf8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),
               (char *)in_stack_fffffffffffffd10);
    str_01._M_str = pcVar3;
    str_01._M_len = (size_t)pcVar2;
    BCLog::LogEscapeMessage_abi_cxx11_(str_01);
    in_stack_fffffffffffffd08 = "R\"(\\x01\\x7f Corrupted log message\\x0d)\"";
    in_stack_fffffffffffffd00 = "\\x01\\x7f Corrupted log message\\x0d";
    in_stack_fffffffffffffcf8 = "BCLog::LogEscapeMessage(\"\\x01\\x7f Corrupted log message\\x0d\")"
    ;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[35]>
              (local_1a8,local_1b8,0x5d4,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcf8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffcf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  file = &local_1c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20,
             CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18),in_stack_fffffffffffffd10
            );
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
               (unsigned_long)in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)line_num,(const_string *)in_stack_fffffffffffffd20);
    in_stack_fffffffffffffd20 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd00,(char (*) [1])in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
               (unsigned_long)in_stack_fffffffffffffcf8);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
    str_02._M_str = pcVar3;
    str_02._M_len = (size_t)pcVar2;
    BCLog::LogEscapeMessage_abi_cxx11_(str_02);
    in_stack_fffffffffffffd08 = "R\"(O\\x00O)\"";
    in_stack_fffffffffffffd00 = "O\\x00O";
    in_stack_fffffffffffffcf8 = "BCLog::LogEscapeMessage(NUL)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
              (local_210,local_220,0x5d7,1,2,local_a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffcf8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffcf8);
    in_stack_fffffffffffffd1f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffd1f);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffcf8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_LogEscapeMessage)
{
    // ASCII and UTF-8 must pass through unaltered.
    BOOST_CHECK_EQUAL(BCLog::LogEscapeMessage("Valid log message貓"), "Valid log message貓");
    // Newlines must pass through unaltered.
    BOOST_CHECK_EQUAL(BCLog::LogEscapeMessage("Message\n with newlines\n"), "Message\n with newlines\n");
    // Other control characters are escaped in C syntax.
    BOOST_CHECK_EQUAL(BCLog::LogEscapeMessage("\x01\x7f Corrupted log message\x0d"), R"(\x01\x7f Corrupted log message\x0d)");
    // Embedded NULL characters are escaped too.
    const std::string NUL("O\x00O", 3);
    BOOST_CHECK_EQUAL(BCLog::LogEscapeMessage(NUL), R"(O\x00O)");
}